

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

Matrix * __thiscall Matrix::operator[](Matrix *__return_storage_ptr__,Matrix *this,int i)

{
  double *pdVar1;
  ulong uVar2;
  int iVar3;
  uint local_6c;
  shared_array<double> local_40;
  uint local_2c;
  int *piStack_28;
  uint s;
  int *sizes;
  uint dimension;
  int i_local;
  Matrix *this_local;
  
  if (this->nMatrixDimension == 1) {
    local_6c = 1;
  }
  else {
    local_6c = this->nMatrixDimension - 1;
  }
  sizes._0_4_ = local_6c;
  uVar2 = SUB168(ZEXT416(local_6c) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_6c) * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  sizes._4_4_ = i;
  _dimension = this;
  this_local = __return_storage_ptr__;
  piStack_28 = (int *)operator_new__(uVar2);
  *piStack_28 = 1;
  for (local_2c = 1; local_2c < (uint)this->nMatrixDimension; local_2c = local_2c + 1) {
    piStack_28[local_2c - 1] = this->pSize[local_2c];
  }
  pdVar1 = this->pData;
  iVar3 = sizes._4_4_ * *this->pMult;
  boost::shared_array<double>::shared_array(&local_40,&this->matrixParent);
  Matrix(__return_storage_ptr__,pdVar1 + iVar3,&local_40,piStack_28,(uint)sizes);
  boost::shared_array<double>::~shared_array(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::operator[](int i)
{
    uint dimension = uint(nMatrixDimension==1 ? 1 : nMatrixDimension-1);
    int *sizes = new int[dimension];
    sizes[0] = 1;
    for (uint s=1; s<uint(nMatrixDimension); s++)
		sizes[s-1] = pSize[s];
    return Matrix( &(pData[i*pMult[0]]), matrixParent, sizes, dimension );
}